

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

bool deqp::gls::inputTypeIsFloatType(InputType type)

{
  undefined1 local_9;
  InputType type_local;
  
  if (type == INPUTTYPE_FLOAT) {
    local_9 = true;
  }
  else if (type == INPUTTYPE_FIXED) {
    local_9 = true;
  }
  else if (type == INPUTTYPE_DOUBLE) {
    local_9 = true;
  }
  else if (type == INPUTTYPE_HALF) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool inputTypeIsFloatType (Array::InputType type)
{
	if (type == Array::INPUTTYPE_FLOAT)
		return true;
	if (type == Array::INPUTTYPE_FIXED)
		return true;
	if (type == Array::INPUTTYPE_DOUBLE)
		return true;
	if (type == Array::INPUTTYPE_HALF)
		return true;
	return false;
}